

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O0

void canvas_rename(_glist *x,t_symbol *s,t_symbol *dir)

{
  _canvasenvironment *p_Var1;
  _canvasenvironment *e;
  t_symbol *dir_local;
  t_symbol *s_local;
  _glist *x_local;
  
  canvas_unbind(x);
  x->gl_name = s;
  canvas_bind(x);
  if ((dir != (t_symbol *)0x0) && (dir != &s_)) {
    p_Var1 = canvas_getenv(x);
    p_Var1->ce_dir = dir;
  }
  if ((*(ushort *)&x->field_0xe8 & 1) != 0) {
    canvas_reflecttitle(x);
  }
  return;
}

Assistant:

void canvas_rename(t_canvas *x, t_symbol *s, t_symbol *dir)
{
    canvas_unbind(x);
    x->gl_name = s;
    canvas_bind(x);
    if (dir && dir != &s_)
    {
        t_canvasenvironment *e = canvas_getenv(x);
        e->ce_dir = dir;
    }
    if (x->gl_havewindow)
        canvas_reflecttitle(x);
}